

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t x_00;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint64_t uVar10;
  long lVar11;
  run_container_t *prVar12;
  uint uVar13;
  long lVar14;
  uint64_t unaff_R13;
  
  lVar8 = (long)(bm->high_low_container).size;
  uVar10 = 0;
  if (lVar8 < 1) {
    return 0;
  }
  x_00 = (uint16_t)x;
  uVar13 = x >> 0x10;
  puVar3 = (bm->high_low_container).keys;
  lVar14 = 0;
  do {
    uVar1 = puVar3[lVar14];
    if (uVar1 < uVar13) {
      prVar12 = (run_container_t *)(bm->high_low_container).containers[lVar14];
      uVar4 = (bm->high_low_container).typecodes[lVar14];
      if (uVar4 == '\x04') {
        uVar4 = *(uint8_t *)&prVar12->runs;
        if (uVar4 == '\x04') {
LAB_0011bb00:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        prVar12 = *(run_container_t **)prVar12;
      }
      if (uVar4 == '\x03') {
        lVar9 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar9 + 4) & 0x20) == 0) {
          iVar5 = prVar12->n_runs;
          lVar9 = (long)iVar5;
          if (0 < lVar9) {
            lVar11 = 0;
            do {
              iVar5 = iVar5 + (uint)prVar12->runs[lVar11].length;
              lVar11 = lVar11 + 1;
            } while (lVar9 != lVar11);
          }
        }
        else {
          iVar5 = _avx2_run_container_cardinality(prVar12);
        }
      }
      else {
        if ((uVar4 != '\x02') && (uVar4 != '\x01')) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar5 = prVar12->n_runs;
      }
      uVar10 = uVar10 + (long)iVar5;
    }
    else {
      if (uVar13 != uVar1) {
        return uVar10;
      }
      prVar12 = (run_container_t *)(bm->high_low_container).containers[lVar14];
      uVar4 = (bm->high_low_container).typecodes[lVar14];
      if (uVar4 == '\x04') {
        uVar4 = *(uint8_t *)&prVar12->runs;
        if (uVar4 == '\x04') goto LAB_0011bb00;
        prVar12 = *(run_container_t **)prVar12;
      }
      if (uVar4 == '\x03') {
        iVar5 = run_container_rank(prVar12,x_00);
      }
      else if (uVar4 == '\x02') {
        if (prVar12->n_runs < 1) {
          iVar5 = 0;
        }
        else {
          iVar5 = prVar12->n_runs + -1;
          iVar7 = 0;
          do {
            uVar6 = (uint)(iVar5 + iVar7) >> 1;
            uVar2 = *(ushort *)((long)&prVar12->runs->value + (ulong)(iVar5 + iVar7 & 0xfffffffe));
            if (uVar2 < x_00) {
              iVar7 = uVar6 + 1;
            }
            else {
              if (uVar2 <= x_00) {
                iVar5 = uVar6 + 1;
                goto LAB_0011bac5;
              }
              iVar5 = uVar6 - 1;
            }
          } while (iVar7 <= iVar5);
          iVar5 = -iVar7;
          if (0 < iVar7) {
            iVar5 = iVar7;
          }
        }
      }
      else {
        if (uVar4 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x18ee,"int container_rank(const container_t *, uint8_t, uint16_t)");
        }
        iVar5 = bitset_container_rank((bitset_container_t *)prVar12,x_00);
      }
LAB_0011bac5:
      unaff_R13 = (long)iVar5 + uVar10;
    }
    if (uVar13 <= uVar1) {
      return unaff_R13;
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == lVar8) {
      return uVar10;
    }
  } while( true );
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}